

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_QuickSortTest(void)

{
  int iVar1;
  word *pData;
  void *__base;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pData = (word *)malloc(8000000);
  __base = malloc(8000000);
  srand(0x457);
  uVar5 = 0;
  lVar3 = 0;
  do {
    iVar1 = rand();
    pData[lVar3] = (long)iVar1 | uVar5;
    *(ulong *)((long)__base + lVar3 * 8) = (long)iVar1 | uVar5;
    lVar3 = lVar3 + 1;
    uVar5 = uVar5 + 0x100000000;
  } while (lVar3 != 1000000);
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Prepare ");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Abc_QuickSort3(pData,1000000,1);
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Sort new");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  qsort(__base,1000000,8,Abc_QuickSort1CompareDec);
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Sort old");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  if (pData != (word *)0x0) {
    free(pData);
  }
  if (__base != (void *)0x0) {
    free(__base);
  }
  return;
}

Assistant:

void Abc_QuickSortTest()
{
    int nSize = 1000000;
    int fVerbose = 0;
    word * pData1, * pData2;
    int i;
    abctime clk = Abc_Clock();
    // generate numbers
    pData1 = ABC_ALLOC( word, nSize );
    pData2 = ABC_ALLOC( word, nSize );
    srand( 1111 );
    for ( i = 0; i < nSize; i++ )
        pData2[i] = pData1[i] = ((word)i << 32) | rand();
    Abc_PrintTime( 1, "Prepare ", Abc_Clock() - clk );
    // perform sorting
    clk = Abc_Clock();
    Abc_QuickSort3( pData1, nSize, 1 );
    Abc_PrintTime( 1, "Sort new", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData1[i] >> 32), (int)pData1[i] );
        printf( "\n" );
    }
    // create new numbers
    clk = Abc_Clock();
    Abc_QuickSort1( pData2, nSize, 1 );
    Abc_PrintTime( 1, "Sort old", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData2[i] >> 32), (int)pData2[i] );
        printf( "\n" );
    }
    ABC_FREE( pData1 );
    ABC_FREE( pData2 );
}